

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrassemblelist.cpp
# Opt level: O2

void __thiscall
TPZDohrAssembleList<float>::TPZDohrAssembleList
          (TPZDohrAssembleList<float> *this,int numitems,TPZFMatrix<float> *output,
          TPZAutoPointer<TPZDohrAssembly<float>_> *assembly)

{
  atomic_int *paVar1;
  TPZReference *pTVar2;
  
  this->fNumItems = numitems;
  TPZSemaphore::TPZSemaphore(&this->fSemaphore);
  (this->fAssemblyLock).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->fAssemblyLock).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(this->fAssemblyLock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->fAssemblyLock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->fListAccessLock).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->fAssemblyLock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->fListAccessLock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->fListAccessLock).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->fListAccessLock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->fListAccessLock).super___mutex_base._M_mutex + 8) = 0;
  (this->fWork).
  super__List_base<TPZAutoPointer<TPZDohrAssembleItem<float>_>,_std::allocator<TPZAutoPointer<TPZDohrAssembleItem<float>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->fWork;
  (this->fWork).
  super__List_base<TPZAutoPointer<TPZDohrAssembleItem<float>_>,_std::allocator<TPZAutoPointer<TPZDohrAssembleItem<float>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->fWork;
  (this->fWork).
  super__List_base<TPZAutoPointer<TPZDohrAssembleItem<float>_>,_std::allocator<TPZAutoPointer<TPZDohrAssembleItem<float>_>_>_>
  ._M_impl._M_node._M_size = 0;
  pTVar2 = assembly->fRef;
  (this->fAssembleIndexes).fRef = pTVar2;
  LOCK();
  paVar1 = &pTVar2->fCounter;
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
  UNLOCK();
  this->fOutput = output;
  return;
}

Assistant:

TPZDohrAssembleList<TVar>::TPZDohrAssembleList(int numitems, TPZFMatrix<TVar> &output, TPZAutoPointer<TPZDohrAssembly<TVar> > assembly) : fNumItems(numitems),
fAssembleIndexes(assembly), fOutput(&output), fAssemblyLock(), fListAccessLock()
{
}